

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_no_field_presence.pb.cc
# Opt level: O3

size_t __thiscall proto2_nofieldpresence_unittest::TestAllTypes::ByteSizeLong(TestAllTypes *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  size_t sVar16;
  ulong uVar17;
  long lVar18;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar19;
  Rep *pRVar20;
  undefined4 uVar21;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 extraout_EDX_01;
  undefined4 extraout_EDX_02;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  long lVar23;
  int n;
  RepeatedPtrField<proto2_nofieldpresence_unittest::TestAllTypes_NestedMessage> *pRVar24;
  int n_1;
  long lVar25;
  long lVar26;
  RepeatedPtrField<proto2_nofieldpresence_unittest::TestAllTypes_NestedMessage> *pRVar27;
  RepeatedPtrField<proto2_nofieldpresence_unittest::ForeignMessage> *pRVar28;
  RepeatedPtrField<proto2_unittest::TestAllTypes> *pRVar29;
  RepeatedPtrField<proto2_nofieldpresence_unittest::ForeignMessage> *this_00;
  RepeatedPtrField<proto2_unittest::TestAllTypes> *this_01;
  undefined1 auVar30 [16];
  long local_98;
  long local_90;
  long local_88;
  undefined8 uVar22;
  
  sVar11 = google::protobuf::internal::WireFormatLite::Int32SizeWithPackedTagSize
                     (&(this->field_0)._impl_.repeated_int32_,2,
                      &(this->field_0)._impl_._repeated_int32_cached_byte_size_);
  sVar12 = google::protobuf::internal::WireFormatLite::Int64SizeWithPackedTagSize
                     (&(this->field_0)._impl_.repeated_int64_,2,
                      &(this->field_0)._impl_._repeated_int64_cached_byte_size_);
  sVar13 = google::protobuf::internal::WireFormatLite::UInt32SizeWithPackedTagSize
                     (&(this->field_0)._impl_.repeated_uint32_,2,
                      &(this->field_0)._impl_._repeated_uint32_cached_byte_size_);
  sVar14 = google::protobuf::internal::WireFormatLite::UInt64SizeWithPackedTagSize
                     (&(this->field_0)._impl_.repeated_uint64_,2,
                      &(this->field_0)._impl_._repeated_uint64_cached_byte_size_);
  sVar15 = google::protobuf::internal::WireFormatLite::SInt32SizeWithPackedTagSize
                     (&(this->field_0)._impl_.repeated_sint32_,2,
                      &(this->field_0)._impl_._repeated_sint32_cached_byte_size_);
  sVar16 = google::protobuf::internal::WireFormatLite::SInt64SizeWithPackedTagSize
                     (&(this->field_0)._impl_.repeated_sint64_,2,
                      &(this->field_0)._impl_._repeated_sint64_cached_byte_size_);
  uVar4 = google::protobuf::internal::SooRep::size
                    (&(this->field_0)._impl_.repeated_fixed32_.soo_rep_,
                     (*(byte *)((long)&this->field_0 + 0x98) & 4) == 0);
  if (uVar4 == 0) {
    local_88 = 0;
  }
  else {
    uVar17 = ((long)((ulong)uVar4 << 0x22) >> 0x20) + 1;
    lVar23 = 0x3f;
    if (uVar17 != 0) {
      for (; uVar17 >> lVar23 == 0; lVar23 = lVar23 + -1) {
      }
    }
    local_88 = (ulong)((int)lVar23 * 9 + 0x49U >> 6) + 2;
  }
  uVar5 = google::protobuf::internal::SooRep::size
                    (&(this->field_0)._impl_.repeated_fixed64_.soo_rep_,
                     (*(byte *)((long)&this->field_0 + 0xa8) & 4) == 0);
  if (uVar5 == 0) {
    lVar23 = 0;
  }
  else {
    uVar17 = ((long)((ulong)uVar5 << 0x23) >> 0x20) + 1;
    lVar23 = 0x3f;
    if (uVar17 != 0) {
      for (; uVar17 >> lVar23 == 0; lVar23 = lVar23 + -1) {
      }
    }
    lVar23 = (ulong)((int)lVar23 * 9 + 0x49U >> 6) + 2;
  }
  uVar6 = google::protobuf::internal::SooRep::size
                    (&(this->field_0)._impl_.repeated_sfixed32_.soo_rep_,
                     (*(byte *)((long)&this->field_0 + 0xb8) & 4) == 0);
  if (uVar6 == 0) {
    local_90 = 0;
  }
  else {
    uVar17 = ((long)((ulong)uVar6 << 0x22) >> 0x20) + 1;
    lVar25 = 0x3f;
    if (uVar17 != 0) {
      for (; uVar17 >> lVar25 == 0; lVar25 = lVar25 + -1) {
      }
    }
    local_90 = (ulong)((int)lVar25 * 9 + 0x49U >> 6) + 2;
  }
  uVar7 = google::protobuf::internal::SooRep::size
                    (&(this->field_0)._impl_.repeated_sfixed64_.soo_rep_,
                     (*(byte *)((long)&this->field_0 + 200) & 4) == 0);
  if (uVar7 == 0) {
    local_98 = 0;
  }
  else {
    uVar17 = ((long)((ulong)uVar7 << 0x23) >> 0x20) + 1;
    lVar25 = 0x3f;
    if (uVar17 != 0) {
      for (; uVar17 >> lVar25 == 0; lVar25 = lVar25 + -1) {
      }
    }
    local_98 = (ulong)((int)lVar25 * 9 + 0x49U >> 6) + 2;
  }
  uVar8 = google::protobuf::internal::SooRep::size
                    (&(this->field_0)._impl_.repeated_float_.soo_rep_,
                     (*(byte *)((long)&this->field_0 + 0xd8) & 4) == 0);
  if (uVar8 == 0) {
    lVar25 = 0;
  }
  else {
    uVar17 = ((long)((ulong)uVar8 << 0x22) >> 0x20) + 1;
    lVar25 = 0x3f;
    if (uVar17 != 0) {
      for (; uVar17 >> lVar25 == 0; lVar25 = lVar25 + -1) {
      }
    }
    lVar25 = (ulong)((int)lVar25 * 9 + 0x49U >> 6) + 2;
  }
  uVar9 = google::protobuf::internal::SooRep::size
                    (&(this->field_0)._impl_.repeated_double_.soo_rep_,
                     (*(byte *)((long)&this->field_0 + 0xe8) & 4) == 0);
  if (uVar9 == 0) {
    lVar26 = 0;
  }
  else {
    uVar17 = ((long)((ulong)uVar9 << 0x23) >> 0x20) + 1;
    lVar26 = 0x3f;
    if (uVar17 != 0) {
      for (; uVar17 >> lVar26 == 0; lVar26 = lVar26 + -1) {
      }
    }
    lVar26 = (ulong)((int)lVar26 * 9 + 0x49U >> 6) + 2;
  }
  uVar10 = google::protobuf::internal::SooRep::size
                     (&(this->field_0)._impl_.repeated_bool_.soo_rep_,
                      (*(byte *)((long)&this->field_0 + 0xf8) & 4) == 0);
  if (uVar10 == 0) {
    lVar18 = 0;
  }
  else {
    lVar18 = 0x3f;
    if ((long)(int)(uVar10 | 1) != 0) {
      for (; (ulong)(long)(int)(uVar10 | 1) >> lVar18 == 0; lVar18 = lVar18 + -1) {
      }
    }
    lVar18 = (ulong)((int)lVar18 * 9 + 0x49U >> 6) + 2;
  }
  uVar1 = *(uint *)((long)&this->field_0 + 0x110);
  lVar23 = lVar26 + (ulong)uVar10 + lVar18 +
           ((ulong)uVar6 + (ulong)uVar4 + (ulong)uVar8) * 4 +
           lVar23 + local_90 + local_98 +
           sVar15 + sVar16 + local_88 + sVar13 + sVar14 + sVar12 + sVar11 + lVar25 +
           ((ulong)uVar7 + (ulong)uVar5 + (ulong)uVar9) * 8 + (ulong)uVar1 * 2;
  if (0 < (int)uVar1) {
    uVar4 = 0;
    do {
      pVVar19 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                          (&(this->field_0)._impl_.repeated_string_.super_RepeatedPtrFieldBase,uVar4
                          );
      uVar5 = (uint)pVVar19->_M_string_length | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      lVar23 = lVar23 + pVVar19->_M_string_length + (ulong)(iVar2 * 9 + 0x49U >> 6);
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  uVar4 = *(uint *)((long)&this->field_0 + 0x128);
  lVar23 = lVar23 + (ulong)uVar4 * 2;
  if (0 < (int)uVar4) {
    uVar5 = 0;
    do {
      pVVar19 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                          (&(this->field_0)._impl_.repeated_bytes_.super_RepeatedPtrFieldBase,uVar5)
      ;
      uVar6 = (uint)pVVar19->_M_string_length | 1;
      iVar2 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      lVar23 = lVar23 + pVVar19->_M_string_length + (ulong)(iVar2 * 9 + 0x49U >> 6);
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  iVar2 = *(int *)((long)&this->field_0 + 0x140);
  pRVar24 = &(this->field_0)._impl_.repeated_nested_message_;
  pRVar27 = pRVar24;
  if ((*(byte *)((long)&this->field_0 + 0x138) & 1) != 0) {
    pRVar20 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                        (&pRVar24->super_RepeatedPtrFieldBase);
    pRVar27 = (RepeatedPtrField<proto2_nofieldpresence_unittest::TestAllTypes_NestedMessage> *)
              pRVar20->elements;
    if (((ulong)(pRVar24->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
      pRVar20 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                          (&pRVar24->super_RepeatedPtrFieldBase);
      pRVar24 = (RepeatedPtrField<proto2_nofieldpresence_unittest::TestAllTypes_NestedMessage> *)
                pRVar20->elements;
    }
  }
  lVar23 = lVar23 + (long)iVar2 * 2;
  iVar2 = *(int *)((long)&this->field_0 + 0x140);
  for (; pRVar27 !=
         (RepeatedPtrField<proto2_nofieldpresence_unittest::TestAllTypes_NestedMessage> *)
         (&(pRVar24->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar2);
      pRVar27 = (RepeatedPtrField<proto2_nofieldpresence_unittest::TestAllTypes_NestedMessage> *)
                &(pRVar27->super_RepeatedPtrFieldBase).current_size_) {
    sVar11 = TestAllTypes_NestedMessage::ByteSizeLong
                       ((TestAllTypes_NestedMessage *)
                        (pRVar27->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar4 = (uint)sVar11 | 1;
    iVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    lVar23 = lVar23 + sVar11 + (ulong)(iVar3 * 9 + 0x49U >> 6);
  }
  iVar2 = *(int *)((long)&this->field_0 + 0x158);
  this_00 = &(this->field_0)._impl_.repeated_foreign_message_;
  pRVar28 = this_00;
  if ((*(byte *)((long)&this->field_0 + 0x150) & 1) != 0) {
    pRVar20 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                        (&this_00->super_RepeatedPtrFieldBase);
    pRVar28 = (RepeatedPtrField<proto2_nofieldpresence_unittest::ForeignMessage> *)pRVar20->elements
    ;
    if (((ulong)(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
      pRVar20 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                          (&this_00->super_RepeatedPtrFieldBase);
      this_00 = (RepeatedPtrField<proto2_nofieldpresence_unittest::ForeignMessage> *)
                pRVar20->elements;
    }
  }
  lVar23 = lVar23 + (long)iVar2 * 2;
  iVar2 = *(int *)((long)&this->field_0 + 0x158);
  for (; pRVar28 !=
         (RepeatedPtrField<proto2_nofieldpresence_unittest::ForeignMessage> *)
         (&(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar2);
      pRVar28 = (RepeatedPtrField<proto2_nofieldpresence_unittest::ForeignMessage> *)
                &(pRVar28->super_RepeatedPtrFieldBase).current_size_) {
    sVar11 = ForeignMessage::ByteSizeLong
                       ((ForeignMessage *)(pRVar28->super_RepeatedPtrFieldBase).tagged_rep_or_elem_)
    ;
    uVar4 = (uint)sVar11 | 1;
    iVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    lVar23 = lVar23 + sVar11 + (ulong)(iVar3 * 9 + 0x49U >> 6);
  }
  iVar2 = *(int *)((long)&this->field_0 + 0x170);
  this_01 = &(this->field_0)._impl_.repeated_proto2_message_;
  pRVar29 = this_01;
  if ((*(byte *)((long)&this->field_0 + 0x168) & 1) != 0) {
    pRVar20 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                        (&this_01->super_RepeatedPtrFieldBase);
    pRVar29 = (RepeatedPtrField<proto2_unittest::TestAllTypes> *)pRVar20->elements;
    if (((ulong)(this_01->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
      pRVar20 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                          (&this_01->super_RepeatedPtrFieldBase);
      this_01 = (RepeatedPtrField<proto2_unittest::TestAllTypes> *)pRVar20->elements;
    }
  }
  lVar23 = lVar23 + (long)iVar2 * 2;
  iVar2 = *(int *)((long)&this->field_0 + 0x170);
  for (; pRVar29 !=
         (RepeatedPtrField<proto2_unittest::TestAllTypes> *)
         (&(this_01->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar2);
      pRVar29 = (RepeatedPtrField<proto2_unittest::TestAllTypes> *)
                &(pRVar29->super_RepeatedPtrFieldBase).current_size_) {
    sVar11 = proto2_unittest::TestAllTypes::ByteSizeLong
                       ((TestAllTypes *)(pRVar29->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar4 = (uint)sVar11 | 1;
    iVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    lVar23 = lVar23 + sVar11 + (ulong)(iVar3 * 9 + 0x49U >> 6);
  }
  sVar11 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                     (&(this->field_0)._impl_.repeated_nested_enum_,2,
                      &(this->field_0)._impl_._repeated_nested_enum_cached_byte_size_);
  sVar12 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                     (&(this->field_0)._impl_.repeated_foreign_enum_,2,
                      &(this->field_0)._impl_._repeated_foreign_enum_cached_byte_size_);
  uVar4 = *(uint *)((long)&this->field_0 + 0x1b8);
  lVar23 = sVar12 + sVar11 + lVar23 + (ulong)uVar4 * 2;
  uVar22 = extraout_RDX;
  if (0 < (int)uVar4) {
    uVar5 = 0;
    do {
      pVVar19 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                          (&(this->field_0)._impl_.repeated_string_piece_.super_RepeatedPtrFieldBase
                           ,uVar5);
      uVar6 = (uint)pVVar19->_M_string_length | 1;
      iVar2 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      lVar23 = lVar23 + pVVar19->_M_string_length + (ulong)(iVar2 * 9 + 0x49U >> 6);
      uVar5 = uVar5 + 1;
      uVar22 = extraout_RDX_00;
    } while (uVar4 != uVar5);
  }
  uVar4 = *(uint *)((long)&this->field_0 + 0x1d0);
  lVar23 = lVar23 + (ulong)uVar4 * 2;
  if (0 < (int)uVar4) {
    uVar5 = 0;
    do {
      pVVar19 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                          (&(this->field_0)._impl_.repeated_cord_.super_RepeatedPtrFieldBase,uVar5);
      uVar6 = (uint)pVVar19->_M_string_length | 1;
      iVar2 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      lVar23 = lVar23 + pVVar19->_M_string_length + (ulong)(iVar2 * 9 + 0x49U >> 6);
      uVar5 = uVar5 + 1;
      uVar22 = extraout_RDX_01;
    } while (uVar4 != uVar5);
  }
  iVar2 = *(int *)((long)&this->field_0 + 0x1e8);
  pRVar24 = &(this->field_0)._impl_.repeated_lazy_message_;
  pRVar27 = pRVar24;
  if ((*(byte *)((long)&this->field_0 + 0x1e0) & 1) != 0) {
    pRVar20 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                        (&pRVar24->super_RepeatedPtrFieldBase);
    uVar22 = extraout_RDX_02;
    pRVar27 = (RepeatedPtrField<proto2_nofieldpresence_unittest::TestAllTypes_NestedMessage> *)
              pRVar20->elements;
    if (((ulong)(pRVar24->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
      pRVar20 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                          (&pRVar24->super_RepeatedPtrFieldBase);
      pRVar24 = (RepeatedPtrField<proto2_nofieldpresence_unittest::TestAllTypes_NestedMessage> *)
                pRVar20->elements;
      uVar22 = extraout_RDX_03;
    }
  }
  sVar11 = (long)iVar2 * 2 + lVar23;
  iVar2 = *(int *)((long)&this->field_0 + 0x1e8);
  for (; uVar21 = (undefined4)uVar22,
      pRVar27 !=
      (RepeatedPtrField<proto2_nofieldpresence_unittest::TestAllTypes_NestedMessage> *)
      (&(pRVar24->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar2);
      pRVar27 = (RepeatedPtrField<proto2_nofieldpresence_unittest::TestAllTypes_NestedMessage> *)
                &(pRVar27->super_RepeatedPtrFieldBase).current_size_) {
    sVar12 = TestAllTypes_NestedMessage::ByteSizeLong
                       ((TestAllTypes_NestedMessage *)
                        (pRVar27->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar4 = (uint)sVar12 | 1;
    iVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    sVar11 = sVar11 + sVar12 + (ulong)(iVar3 * 9 + 0x49U >> 6);
    uVar22 = extraout_RDX_04;
  }
  uVar4 = *(uint *)&this->field_0;
  if ((char)uVar4 != '\0') {
    if (((uVar4 & 1) != 0) &&
       (lVar23 = *(long *)(((ulong)(this->field_0)._impl_.optional_string_.tagged_ptr_.ptr_ &
                           0xfffffffffffffffc) + 8), lVar23 != 0)) {
      uVar5 = (uint)lVar23 | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar11 = sVar11 + lVar23 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if (((uVar4 & 2) != 0) &&
       (lVar23 = *(long *)(((ulong)(this->field_0)._impl_.optional_bytes_.tagged_ptr_.ptr_ &
                           0xfffffffffffffffc) + 8), lVar23 != 0)) {
      uVar5 = (uint)lVar23 | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar11 = sVar11 + lVar23 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if (((uVar4 & 4) != 0) &&
       (lVar23 = *(long *)(((ulong)(this->field_0)._impl_.optional_string_piece_.tagged_ptr_.ptr_ &
                           0xfffffffffffffffc) + 8), lVar23 != 0)) {
      uVar5 = (uint)lVar23 | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar11 = sVar11 + lVar23 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
    }
    if (((uVar4 & 8) != 0) &&
       (lVar23 = *(long *)(((ulong)(this->field_0)._impl_.optional_cord_.tagged_ptr_.ptr_ &
                           0xfffffffffffffffc) + 8), lVar23 != 0)) {
      uVar5 = (uint)lVar23 | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar11 = sVar11 + lVar23 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar4 & 0x10) != 0) {
      sVar12 = TestAllTypes_NestedMessage::ByteSizeLong
                         ((this->field_0)._impl_.optional_nested_message_);
      uVar5 = (uint)sVar12 | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar11 = sVar11 + sVar12 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
      uVar21 = extraout_EDX;
    }
    if ((uVar4 & 0x20) != 0) {
      sVar12 = ForeignMessage::ByteSizeLong((this->field_0)._impl_.optional_foreign_message_);
      uVar5 = (uint)sVar12 | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar11 = sVar11 + sVar12 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
      uVar21 = extraout_EDX_00;
    }
    if ((uVar4 & 0x40) != 0) {
      sVar12 = proto2_unittest::TestAllTypes::ByteSizeLong
                         ((this->field_0)._impl_.optional_proto2_message_);
      uVar5 = (uint)sVar12 | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar11 = sVar11 + sVar12 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
      uVar21 = extraout_EDX_01;
    }
    if ((char)uVar4 < '\0') {
      sVar12 = TestAllTypes_NestedMessage::ByteSizeLong
                         ((this->field_0)._impl_.optional_lazy_message_);
      uVar5 = (uint)sVar12 | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar11 = sVar11 + sVar12 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
      uVar21 = extraout_EDX_02;
    }
  }
  if ((uVar4 & 0xff00) != 0) {
    if (((uVar4 >> 8 & 1) != 0) && (uVar17 = (this->field_0)._impl_.optional_int64_, uVar17 != 0)) {
      uVar17 = uVar17 | 1;
      lVar23 = 0x3f;
      if (uVar17 != 0) {
        for (; uVar17 >> lVar23 == 0; lVar23 = lVar23 + -1) {
        }
      }
      sVar11 = sVar11 + ((int)lVar23 * 9 + 0x89U >> 6);
    }
    if (((uVar4 >> 9 & 1) != 0) &&
       (uVar17 = (ulong)(this->field_0)._impl_.optional_int32_, uVar17 != 0)) {
      uVar17 = uVar17 | 1;
      lVar23 = 0x3f;
      if (uVar17 != 0) {
        for (; uVar17 >> lVar23 == 0; lVar23 = lVar23 + -1) {
        }
      }
      sVar11 = sVar11 + ((int)lVar23 * 9 + 0x89U >> 6);
    }
    if (((uVar4 >> 10 & 1) != 0) && (uVar5 = (this->field_0)._impl_.optional_uint32_, uVar5 != 0)) {
      uVar5 = uVar5 | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar11 = sVar11 + (iVar2 * 9 + 0x89U >> 6);
    }
    if (((uVar4 >> 0xb & 1) != 0) && (uVar17 = (this->field_0)._impl_.optional_uint64_, uVar17 != 0)
       ) {
      uVar17 = uVar17 | 1;
      lVar23 = 0x3f;
      if (uVar17 != 0) {
        for (; uVar17 >> lVar23 == 0; lVar23 = lVar23 + -1) {
        }
      }
      sVar11 = sVar11 + ((int)lVar23 * 9 + 0x89U >> 6);
    }
    if (((uVar4 >> 0xc & 1) != 0) && (lVar23 = (this->field_0)._impl_.optional_sint64_, lVar23 != 0)
       ) {
      uVar17 = lVar23 >> 0x3f ^ lVar23 * 2 | 1;
      lVar23 = 0x3f;
      if (uVar17 != 0) {
        for (; uVar17 >> lVar23 == 0; lVar23 = lVar23 + -1) {
        }
      }
      sVar11 = sVar11 + ((int)lVar23 * 9 + 0x89U >> 6);
    }
    if (((uVar4 >> 0xd & 1) != 0) && (iVar2 = (this->field_0)._impl_.optional_sint32_, iVar2 != 0))
    {
      uVar5 = iVar2 >> 0x1f ^ iVar2 * 2 | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar11 = sVar11 + (iVar2 * 9 + 0x89U >> 6);
    }
    sVar12 = sVar11 + 5;
    if ((this->field_0)._impl_.optional_fixed32_ == 0) {
      sVar12 = sVar11;
    }
    if ((uVar4 >> 0xe & 1) == 0) {
      sVar12 = sVar11;
    }
    sVar11 = sVar12;
    if (((short)uVar4 < 0) && ((this->field_0)._impl_.optional_fixed64_ != 0)) {
      sVar11 = sVar12 + 9;
    }
  }
  if ((uVar4 & 0x7f0000) != 0) {
    sVar12 = sVar11 + 9;
    if ((this->field_0)._impl_.optional_sfixed64_ == 0) {
      sVar12 = sVar11;
    }
    if ((uVar4 >> 0x10 & 1) == 0) {
      sVar12 = sVar11;
    }
    sVar11 = sVar12 + 5;
    if ((this->field_0)._impl_.optional_sfixed32_ == 0) {
      sVar11 = sVar12;
    }
    if ((uVar4 >> 0x11 & 1) == 0) {
      sVar11 = sVar12;
    }
    auVar30._0_4_ = -(uint)((uVar4 & 0x200000) == 0);
    auVar30._4_4_ = -(uint)((uVar4 & 0x100000) == 0);
    auVar30._8_4_ = -(uint)((uVar4 & 0x80000) == 0);
    auVar30._12_4_ = -(uint)((uVar4 & 0x40000) == 0);
    uVar5 = movmskps(uVar21,auVar30);
    sVar12 = sVar11 + 5;
    if ((this->field_0)._impl_.optional_float_ == 0.0) {
      sVar12 = sVar11;
    }
    if ((uVar5 & 8) != 0) {
      sVar12 = sVar11;
    }
    sVar13 = sVar12 + 9;
    if ((this->field_0)._impl_.optional_double_ == 0.0) {
      sVar13 = sVar12;
    }
    if ((uVar5 & 4) != 0) {
      sVar13 = sVar12;
    }
    sVar11 = sVar13 + 2;
    if (((this->field_0)._impl_.optional_bool_ & 1U) == 0) {
      sVar11 = sVar13;
    }
    if ((uVar5 & 2) != 0) {
      sVar11 = sVar13;
    }
    if (((uVar5 & 1) == 0) &&
       (uVar17 = (ulong)(this->field_0)._impl_.optional_nested_enum_, uVar17 != 0)) {
      uVar17 = uVar17 | 1;
      lVar23 = 0x3f;
      if (uVar17 != 0) {
        for (; uVar17 >> lVar23 == 0; lVar23 = lVar23 + -1) {
        }
      }
      sVar11 = sVar11 + ((int)lVar23 * 9 + 0x49U >> 6) + 2;
    }
    if (((uVar4 >> 0x16 & 1) != 0) &&
       (uVar17 = (ulong)(this->field_0)._impl_.optional_foreign_enum_, uVar17 != 0)) {
      uVar17 = uVar17 | 1;
      lVar23 = 0x3f;
      if (uVar17 != 0) {
        for (; uVar17 >> lVar23 == 0; lVar23 = lVar23 + -1) {
        }
      }
      sVar11 = sVar11 + ((int)lVar23 * 9 + 0x49U >> 6) + 2;
    }
  }
  switch((this->field_0)._impl_._oneof_case_[0]) {
  case 0x6f:
    uVar17 = (ulong)*(uint *)((long)&this->field_0 + 0x290);
    goto LAB_00ce73be;
  case 0x70:
    uVar17 = TestAllTypes_NestedMessage::ByteSizeLong
                       ((this->field_0)._impl_.oneof_field_.oneof_nested_message_);
    break;
  case 0x71:
    uVar17 = *(ulong *)(((ulong)(this->field_0)._impl_.oneof_field_.oneof_nested_message_ &
                        0xfffffffffffffffc) + 8);
    break;
  case 0x72:
    uVar17 = (long)*(int *)((long)&this->field_0 + 0x290) | 1;
    lVar23 = 0x3f;
    if (uVar17 != 0) {
      for (; uVar17 >> lVar23 == 0; lVar23 = lVar23 + -1) {
      }
    }
    sVar11 = sVar11 + ((int)lVar23 * 9 + 0x49U >> 6) + 2;
  default:
    goto switchD_00ce7373_default;
  }
  sVar11 = sVar11 + uVar17;
LAB_00ce73be:
  uVar4 = (uint)uVar17 | 1;
  iVar2 = 0x1f;
  if (uVar4 != 0) {
    for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
    }
  }
  sVar11 = sVar11 + (iVar2 * 9 + 0x49U >> 6) + 2;
switchD_00ce7373_default:
  sVar11 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                     (&this->super_Message,sVar11,&(this->field_0)._impl_._cached_size_);
  return sVar11;
}

Assistant:

::size_t TestAllTypes::ByteSizeLong() const {
  const TestAllTypes& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_nofieldpresence_unittest.TestAllTypes)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated int32 repeated_int32 = 31;
    {
      total_size +=
          ::_pbi::WireFormatLite::Int32SizeWithPackedTagSize(
              this_._internal_repeated_int32(), 2,
              this_._impl_._repeated_int32_cached_byte_size_);
    }
    // repeated int64 repeated_int64 = 32;
    {
      total_size +=
          ::_pbi::WireFormatLite::Int64SizeWithPackedTagSize(
              this_._internal_repeated_int64(), 2,
              this_._impl_._repeated_int64_cached_byte_size_);
    }
    // repeated uint32 repeated_uint32 = 33;
    {
      total_size +=
          ::_pbi::WireFormatLite::UInt32SizeWithPackedTagSize(
              this_._internal_repeated_uint32(), 2,
              this_._impl_._repeated_uint32_cached_byte_size_);
    }
    // repeated uint64 repeated_uint64 = 34;
    {
      total_size +=
          ::_pbi::WireFormatLite::UInt64SizeWithPackedTagSize(
              this_._internal_repeated_uint64(), 2,
              this_._impl_._repeated_uint64_cached_byte_size_);
    }
    // repeated sint32 repeated_sint32 = 35;
    {
      total_size +=
          ::_pbi::WireFormatLite::SInt32SizeWithPackedTagSize(
              this_._internal_repeated_sint32(), 2,
              this_._impl_._repeated_sint32_cached_byte_size_);
    }
    // repeated sint64 repeated_sint64 = 36;
    {
      total_size +=
          ::_pbi::WireFormatLite::SInt64SizeWithPackedTagSize(
              this_._internal_repeated_sint64(), 2,
              this_._impl_._repeated_sint64_cached_byte_size_);
    }
    // repeated fixed32 repeated_fixed32 = 37;
    {
      ::size_t data_size = ::size_t{4} *
          ::_pbi::FromIntSize(this_._internal_repeated_fixed32_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated fixed64 repeated_fixed64 = 38;
    {
      ::size_t data_size = ::size_t{8} *
          ::_pbi::FromIntSize(this_._internal_repeated_fixed64_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated sfixed32 repeated_sfixed32 = 39;
    {
      ::size_t data_size = ::size_t{4} *
          ::_pbi::FromIntSize(this_._internal_repeated_sfixed32_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated sfixed64 repeated_sfixed64 = 40;
    {
      ::size_t data_size = ::size_t{8} *
          ::_pbi::FromIntSize(this_._internal_repeated_sfixed64_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated float repeated_float = 41;
    {
      ::size_t data_size = ::size_t{4} *
          ::_pbi::FromIntSize(this_._internal_repeated_float_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated double repeated_double = 42;
    {
      ::size_t data_size = ::size_t{8} *
          ::_pbi::FromIntSize(this_._internal_repeated_double_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated bool repeated_bool = 43;
    {
      ::size_t data_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_repeated_bool_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated string repeated_string = 44;
    {
      total_size +=
          2 * ::google::protobuf::internal::FromIntSize(this_._internal_repeated_string().size());
      for (int i = 0, n = this_._internal_repeated_string().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_repeated_string().Get(i));
      }
    }
    // repeated bytes repeated_bytes = 45;
    {
      total_size +=
          2 * ::google::protobuf::internal::FromIntSize(this_._internal_repeated_bytes().size());
      for (int i = 0, n = this_._internal_repeated_bytes().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::BytesSize(
            this_._internal_repeated_bytes().Get(i));
      }
    }
    // repeated .proto2_nofieldpresence_unittest.TestAllTypes.NestedMessage repeated_nested_message = 48;
    {
      total_size += 2UL * this_._internal_repeated_nested_message_size();
      for (const auto& msg : this_._internal_repeated_nested_message()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .proto2_nofieldpresence_unittest.ForeignMessage repeated_foreign_message = 49;
    {
      total_size += 2UL * this_._internal_repeated_foreign_message_size();
      for (const auto& msg : this_._internal_repeated_foreign_message()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .proto2_unittest.TestAllTypes repeated_proto2_message = 50;
    {
      total_size += 2UL * this_._internal_repeated_proto2_message_size();
      for (const auto& msg : this_._internal_repeated_proto2_message()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .proto2_nofieldpresence_unittest.TestAllTypes.NestedEnum repeated_nested_enum = 51;
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_repeated_nested_enum(), 2, this_._impl_._repeated_nested_enum_cached_byte_size_);
    }
    // repeated .proto2_nofieldpresence_unittest.ForeignEnum repeated_foreign_enum = 52;
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_repeated_foreign_enum(), 2, this_._impl_._repeated_foreign_enum_cached_byte_size_);
    }
    // repeated string repeated_string_piece = 54 [ctype = STRING_PIECE];
    {
      total_size +=
          2 * ::google::protobuf::internal::FromIntSize(this_._internal_repeated_string_piece().size());
      for (int i = 0, n = this_._internal_repeated_string_piece().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_repeated_string_piece().Get(i));
      }
    }
    // repeated string repeated_cord = 55 [ctype = CORD];
    {
      total_size +=
          2 * ::google::protobuf::internal::FromIntSize(this_._internal_repeated_cord().size());
      for (int i = 0, n = this_._internal_repeated_cord().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_repeated_cord().Get(i));
      }
    }
    // repeated .proto2_nofieldpresence_unittest.TestAllTypes.NestedMessage repeated_lazy_message = 57;
    {
      total_size += 2UL * this_._internal_repeated_lazy_message_size();
      for (const auto& msg : this_._internal_repeated_lazy_message()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    // string optional_string = 14;
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (!this_._internal_optional_string().empty()) {
        total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                        this_._internal_optional_string());
      }
    }
    // bytes optional_bytes = 15;
    if ((cached_has_bits & 0x00000002u) != 0) {
      if (!this_._internal_optional_bytes().empty()) {
        total_size += 1 + ::google::protobuf::internal::WireFormatLite::BytesSize(
                                        this_._internal_optional_bytes());
      }
    }
    // string optional_string_piece = 24 [ctype = STRING_PIECE];
    if ((cached_has_bits & 0x00000004u) != 0) {
      if (!this_._internal_optional_string_piece().empty()) {
        total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                        this_._internal_optional_string_piece());
      }
    }
    // string optional_cord = 25 [ctype = CORD];
    if ((cached_has_bits & 0x00000008u) != 0) {
      if (!this_._internal_optional_cord().empty()) {
        total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                        this_._internal_optional_cord());
      }
    }
    // .proto2_nofieldpresence_unittest.TestAllTypes.NestedMessage optional_nested_message = 18;
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_nested_message_);
    }
    // .proto2_nofieldpresence_unittest.ForeignMessage optional_foreign_message = 19;
    if ((cached_has_bits & 0x00000020u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_foreign_message_);
    }
    // .proto2_unittest.TestAllTypes optional_proto2_message = 20;
    if ((cached_has_bits & 0x00000040u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_proto2_message_);
    }
    // .proto2_nofieldpresence_unittest.TestAllTypes.NestedMessage optional_lazy_message = 30 [lazy = true];
    if ((cached_has_bits & 0x00000080u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_lazy_message_);
    }
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    // int64 optional_int64 = 2;
    if ((cached_has_bits & 0x00000100u) != 0) {
      if (this_._internal_optional_int64() != 0) {
        total_size += ::_pbi::WireFormatLite::Int64SizePlusOne(
            this_._internal_optional_int64());
      }
    }
    // int32 optional_int32 = 1;
    if ((cached_has_bits & 0x00000200u) != 0) {
      if (this_._internal_optional_int32() != 0) {
        total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
            this_._internal_optional_int32());
      }
    }
    // uint32 optional_uint32 = 3;
    if ((cached_has_bits & 0x00000400u) != 0) {
      if (this_._internal_optional_uint32() != 0) {
        total_size += ::_pbi::WireFormatLite::UInt32SizePlusOne(
            this_._internal_optional_uint32());
      }
    }
    // uint64 optional_uint64 = 4;
    if ((cached_has_bits & 0x00000800u) != 0) {
      if (this_._internal_optional_uint64() != 0) {
        total_size += ::_pbi::WireFormatLite::UInt64SizePlusOne(
            this_._internal_optional_uint64());
      }
    }
    // sint64 optional_sint64 = 6;
    if ((cached_has_bits & 0x00001000u) != 0) {
      if (this_._internal_optional_sint64() != 0) {
        total_size += ::_pbi::WireFormatLite::SInt64SizePlusOne(
            this_._internal_optional_sint64());
      }
    }
    // sint32 optional_sint32 = 5;
    if ((cached_has_bits & 0x00002000u) != 0) {
      if (this_._internal_optional_sint32() != 0) {
        total_size += ::_pbi::WireFormatLite::SInt32SizePlusOne(
            this_._internal_optional_sint32());
      }
    }
    // fixed32 optional_fixed32 = 7;
    if ((cached_has_bits & 0x00004000u) != 0) {
      if (this_._internal_optional_fixed32() != 0) {
        total_size += 5;
      }
    }
    // fixed64 optional_fixed64 = 8;
    if ((cached_has_bits & 0x00008000u) != 0) {
      if (this_._internal_optional_fixed64() != 0) {
        total_size += 9;
      }
    }
  }
  if ((cached_has_bits & 0x007f0000u) != 0) {
    // sfixed64 optional_sfixed64 = 10;
    if ((cached_has_bits & 0x00010000u) != 0) {
      if (this_._internal_optional_sfixed64() != 0) {
        total_size += 9;
      }
    }
    // sfixed32 optional_sfixed32 = 9;
    if ((cached_has_bits & 0x00020000u) != 0) {
      if (this_._internal_optional_sfixed32() != 0) {
        total_size += 5;
      }
    }
    // float optional_float = 11;
    if ((cached_has_bits & 0x00040000u) != 0) {
      if (::absl::bit_cast<::uint32_t>(this_._internal_optional_float()) != 0) {
        total_size += 5;
      }
    }
    // double optional_double = 12;
    if ((cached_has_bits & 0x00080000u) != 0) {
      if (::absl::bit_cast<::uint64_t>(this_._internal_optional_double()) != 0) {
        total_size += 9;
      }
    }
    // bool optional_bool = 13;
    if ((cached_has_bits & 0x00100000u) != 0) {
      if (this_._internal_optional_bool() != 0) {
        total_size += 2;
      }
    }
    // .proto2_nofieldpresence_unittest.TestAllTypes.NestedEnum optional_nested_enum = 21;
    if ((cached_has_bits & 0x00200000u) != 0) {
      if (this_._internal_optional_nested_enum() != 0) {
        total_size += 2 +
                      ::_pbi::WireFormatLite::EnumSize(this_._internal_optional_nested_enum());
      }
    }
    // .proto2_nofieldpresence_unittest.ForeignEnum optional_foreign_enum = 22;
    if ((cached_has_bits & 0x00400000u) != 0) {
      if (this_._internal_optional_foreign_enum() != 0) {
        total_size += 2 +
                      ::_pbi::WireFormatLite::EnumSize(this_._internal_optional_foreign_enum());
      }
    }
  }
  switch (this_.oneof_field_case()) {
    // uint32 oneof_uint32 = 111;
    case kOneofUint32: {
      total_size += 2 + ::_pbi::WireFormatLite::UInt32Size(
                                      this_._internal_oneof_uint32());
      break;
    }
    // .proto2_nofieldpresence_unittest.TestAllTypes.NestedMessage oneof_nested_message = 112;
    case kOneofNestedMessage: {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.oneof_field_.oneof_nested_message_);
      break;
    }
    // string oneof_string = 113;
    case kOneofString: {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_oneof_string());
      break;
    }
    // .proto2_nofieldpresence_unittest.TestAllTypes.NestedEnum oneof_enum = 114;
    case kOneofEnum: {
      total_size += 2 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_oneof_enum());
      break;
    }
    case ONEOF_FIELD_NOT_SET: {
      break;
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}